

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_apu.c
# Opt level: O0

UINT32 nesapu_get_mute_mask(void *chip)

{
  UINT32 muteMask;
  nesapu_state *info;
  void *chip_local;
  
  return (uint)(*(byte *)((long)chip + 0x24) & 1) | (uint)(*(byte *)((long)chip + 0x4c) & 1) << 1 |
         (uint)(*(byte *)((long)chip + 0x74) & 1) << 2 |
         (uint)(*(byte *)((long)chip + 0x97) & 1) << 3 |
         (uint)(*(byte *)((long)chip + 0xc3) & 1) << 4;
}

Assistant:

UINT32 nesapu_get_mute_mask(void* chip)
{
	nesapu_state *info = (nesapu_state*)chip;
	UINT32 muteMask;
	
	muteMask =	(info->APU.squ[0].Muted << 0) |
				(info->APU.squ[1].Muted << 1) |
				(info->APU.tri.Muted << 2) |
				(info->APU.noi.Muted << 3) |
				(info->APU.dpcm.Muted << 4);
	
	return muteMask;
}